

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O1

int tcv_get_tx_cur(tcv_t *tcv,uint16_t *cur)

{
  _func_int_tcv_t_ptr_uint16_t_ptr *p_Var1;
  int iVar2;
  bool bVar3;
  
  if ((tcv == (tcv_t *)0x0) || (tcv->created != true)) {
    bVar3 = false;
  }
  else {
    iVar2 = pthread_mutex_lock((pthread_mutex_t *)&tcv->lock);
    bVar3 = iVar2 == 0;
  }
  iVar2 = -4;
  if ((cur != (uint16_t *)0x0) && (bVar3)) {
    p_Var1 = tcv->fun->get_tx_cur;
    if (p_Var1 == (_func_int_tcv_t_ptr_uint16_t_ptr *)0x0) {
      iVar2 = -0xc;
    }
    else {
      iVar2 = (*p_Var1)(tcv,cur);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&tcv->lock);
  }
  return iVar2;
}

Assistant:

int tcv_get_tx_cur(tcv_t* tcv, uint16_t* cur)
{
	/* Not all have Digital diagnostics */
	int ret = TCV_ERR_FEATURE_NOT_AVAILABLE;

	if (!tcv_check_and_lock_ok(tcv) || !cur)
		return TCV_ERR_INVALID_ARG;

	if (tcv->fun->get_tx_cur)
		ret = tcv->fun->get_tx_cur(tcv, cur);

	tcv_unlock(tcv);
	return ret;
}